

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::SetHasBailedOut(Lowerer *this,Instr *bailoutInstr)

{
  code *pcVar1;
  bool bVar2;
  OpCode opcode;
  undefined4 *puVar3;
  SymOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  Instr *instr;
  Func *func;
  
  func = this->m_func;
  if ((func->field_0x243 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6df2,"(this->m_func->isPostLayout)","this->m_func->isPostLayout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    func = this->m_func;
  }
  dstOpnd = IR::SymOpnd::New(&func->m_hasBailedOutSym->super_Sym,TyUint32,func);
  opcode = LowererMDArch::GetAssignOp(TyUint32);
  src1Opnd = IR::IntConstOpnd::New(1,TyUint32,this->m_func,false);
  instr = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(bailoutInstr,instr);
  LowererMD::Legalize<false>(instr,false);
  return;
}

Assistant:

void
Lowerer::SetHasBailedOut(IR::Instr * bailoutInstr)
{
    Assert(this->m_func->isPostLayout);
    IR::SymOpnd * hasBailedOutOpnd = IR::SymOpnd::New(this->m_func->GetHasBailedOutSym(), TyUint32, this->m_func);
    IR::Instr * setInstr = IR::Instr::New(LowererMD::GetStoreOp(TyUint32), hasBailedOutOpnd, IR::IntConstOpnd::New(1, TyUint32, this->m_func), this->m_func);
    bailoutInstr->InsertBefore(setInstr);
    LowererMD::Legalize(setInstr);
}